

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarProve(Abc_Ntk_t *pNtk,Fra_Sec_t *pSecPar,int nBmcFramesMax,int nBmcConfMax)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  abctime aVar9;
  Abc_Cex_t *pCex;
  Abc_Ntk_t *pAStack_a8;
  int RetValue_1;
  Abc_Ntk_t *pNtkComb;
  Prove_Params_t *pParams;
  Prove_Params_t Params;
  abctime clkTotal;
  int RetValue;
  int iFrame;
  Aig_Man_t *pMan;
  int nBmcConfMax_local;
  int nBmcFramesMax_local;
  Fra_Sec_t *pSecPar_local;
  Abc_Ntk_t *pNtk_local;
  
  clkTotal._4_4_ = 0xffffffff;
  clkTotal._0_4_ = -1;
  pMan._0_4_ = nBmcConfMax;
  pMan._4_4_ = nBmcFramesMax;
  _nBmcConfMax_local = pSecPar;
  pSecPar_local = (Fra_Sec_t *)pNtk;
  Params.nTotalInspectsMade = Abc_Clock();
  if ((_nBmcConfMax_local->fTryComb != 0) ||
     (iVar7 = Abc_NtkLatchNum((Abc_Ntk_t *)pSecPar_local), iVar7 == 0)) {
    pNtkComb = (Abc_Ntk_t *)&pParams;
    iVar7 = Abc_NtkLatchNum((Abc_Ntk_t *)pSecPar_local);
    if (iVar7 == 0) {
      Abc_Print(1,"The network has no latches. Running CEC.\n");
    }
    pAStack_a8 = Abc_NtkDup((Abc_Ntk_t *)pSecPar_local);
    Abc_NtkMakeComb(pAStack_a8,1);
    Prove_ParamsSetDefault((Prove_Params_t *)pNtkComb);
    *(undefined4 *)((long)&pNtkComb->pName + 4) = 1;
    iVar7 = Abc_NtkIvyProve(&stack0xffffffffffffff58,pNtkComb);
    if ((iVar7 == 0) && (iVar8 = Abc_NtkLatchNum((Abc_Ntk_t *)pSecPar_local), iVar8 == 0)) {
      *(int **)&pSecPar_local[2].fInterSeparate = pAStack_a8->pModel;
      pAStack_a8->pModel = (int *)0x0;
      if (_nBmcConfMax_local->fReportSolution == 0) {
        Abc_Print(1,"SATISFIABLE    ");
      }
      else {
        Abc_Print(1,"SOLUTION: FAIL       ");
      }
      Abc_Print(1,"%s =","Time");
      aVar9 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - Params.nTotalInspectsMade) * 1.0) / 1000000.0);
      return 0;
    }
    Abc_NtkDelete(pAStack_a8);
    if (iVar7 == 1) {
      if (_nBmcConfMax_local->fReportSolution == 0) {
        Abc_Print(1,"UNSATISFIABLE  ");
      }
      else {
        Abc_Print(1,"SOLUTION: PASS       ");
      }
      Abc_Print(1,"%s =","Time");
      aVar9 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - Params.nTotalInspectsMade) * 1.0) / 1000000.0);
      return 1;
    }
    iVar8 = Abc_NtkLatchNum((Abc_Ntk_t *)pSecPar_local);
    if (iVar8 == 0) {
      Abc_Print(1,"UNDECIDED      ");
      Abc_Print(1,"%s =","Time");
      aVar9 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - Params.nTotalInspectsMade) * 1.0) / 1000000.0);
      return iVar7;
    }
  }
  _RetValue = Abc_NtkToDar((Abc_Ntk_t *)pSecPar_local,0,1);
  if (_RetValue == (Aig_Man_t *)0x0) {
    Abc_Print(1,"Converting miter into AIG has failed.\n");
    pNtk_local._4_4_ = -1;
  }
  else {
    if (_RetValue->nRegs < 1) {
      __assert_fail("pMan->nRegs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0xb4b,"int Abc_NtkDarProve(Abc_Ntk_t *, Fra_Sec_t *, int, int)");
    }
    if ((_nBmcConfMax_local->fTryBmc == 0) ||
       (clkTotal._0_4_ =
             Saig_BmcPerform(_RetValue,0,pMan._4_4_,2000,0,(int)pMan,0,_nBmcConfMax_local->fVerbose,
                             0,(int *)((long)&clkTotal + 4),0,0), (int)clkTotal != 0)) {
      if (_nBmcConfMax_local->fUseNewProver == 0) {
        clkTotal._0_4_ = Fra_FraigSec(_RetValue,_nBmcConfMax_local,(Aig_Man_t **)0x0);
        lVar3._0_4_ = pSecPar_local[2].fInterSeparate;
        lVar3._4_4_ = pSecPar_local[2].fReachability;
        if (lVar3 != 0) {
          free(*(void **)&pSecPar_local[2].fInterSeparate);
          pSecPar_local[2].fInterSeparate = 0;
          pSecPar_local[2].fReachability = 0;
        }
        lVar4._0_4_ = pSecPar_local[2].fReorderImage;
        lVar4._4_4_ = pSecPar_local[2].fStopOnFirstFail;
        if (lVar4 != 0) {
          free(*(void **)&pSecPar_local[2].fReorderImage);
          pSecPar_local[2].fReorderImage = 0;
          pSecPar_local[2].fStopOnFirstFail = 0;
        }
        *(Abc_Cex_t **)&pSecPar_local[2].fReorderImage = _RetValue->pSeqModel;
        _RetValue->pSeqModel = (Abc_Cex_t *)0x0;
        lVar5._0_4_ = pSecPar_local[2].fReorderImage;
        lVar5._4_4_ = pSecPar_local[2].fStopOnFirstFail;
        if (lVar5 != 0) {
          uVar6._0_4_ = pSecPar_local->nFramesMax;
          uVar6._4_4_ = pSecPar_local->nBTLimit;
          Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.\n",
                    (ulong)**(uint **)&pSecPar_local[2].fReorderImage,uVar6,
                    (ulong)(*(uint **)&pSecPar_local[2].fReorderImage)[1]);
          iVar7 = Saig_ManVerifyCex(_RetValue,*(Abc_Cex_t **)&pSecPar_local[2].fReorderImage);
          if (iVar7 == 0) {
            Abc_Print(1,"Abc_NtkDarProve(): Counter-example verification has FAILED.\n");
          }
        }
      }
      else {
        clkTotal._0_4_ = Ssw_SecGeneralMiter(_RetValue,(Ssw_Pars_t *)0x0);
      }
      Aig_ManStop(_RetValue);
      pNtk_local._4_4_ = (int)clkTotal;
    }
    else {
      Abc_Print(1,"Networks are not equivalent.\n");
      if (_nBmcConfMax_local->fReportSolution != 0) {
        Abc_Print(1,"SOLUTION: FAIL       ");
        Abc_Print(1,"%s =","Time");
        aVar9 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - Params.nTotalInspectsMade) * 1.0) / 1000000.0);
      }
      lVar1._0_4_ = pSecPar_local[2].fInterSeparate;
      lVar1._4_4_ = pSecPar_local[2].fReachability;
      if (lVar1 != 0) {
        free(*(void **)&pSecPar_local[2].fInterSeparate);
        pSecPar_local[2].fInterSeparate = 0;
        pSecPar_local[2].fReachability = 0;
      }
      lVar2._0_4_ = pSecPar_local[2].fReorderImage;
      lVar2._4_4_ = pSecPar_local[2].fStopOnFirstFail;
      if (lVar2 != 0) {
        free(*(void **)&pSecPar_local[2].fReorderImage);
        pSecPar_local[2].fReorderImage = 0;
        pSecPar_local[2].fStopOnFirstFail = 0;
      }
      *(Abc_Cex_t **)&pSecPar_local[2].fReorderImage = _RetValue->pSeqModel;
      _RetValue->pSeqModel = (Abc_Cex_t *)0x0;
      Aig_ManStop(_RetValue);
      pNtk_local._4_4_ = (int)clkTotal;
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDarProve( Abc_Ntk_t * pNtk, Fra_Sec_t * pSecPar, int nBmcFramesMax, int nBmcConfMax )
{
    Aig_Man_t * pMan;
    int iFrame = -1, RetValue = -1;
    abctime clkTotal = Abc_Clock();
    if ( pSecPar->fTryComb || Abc_NtkLatchNum(pNtk) == 0 )
    {
        Prove_Params_t Params, * pParams = &Params;
        Abc_Ntk_t * pNtkComb;
        int RetValue;
        if ( Abc_NtkLatchNum(pNtk) == 0 )
            Abc_Print( 1, "The network has no latches. Running CEC.\n" );
        // create combinational network
        pNtkComb = Abc_NtkDup( pNtk );
        Abc_NtkMakeComb( pNtkComb, 1 );
        // solve it using combinational equivalence checking
        Prove_ParamsSetDefault( pParams );
        pParams->fVerbose = 1;
        RetValue = Abc_NtkIvyProve( &pNtkComb, pParams );
        // transfer model if given
//        pNtk->pModel = pNtkComb->pModel; pNtkComb->pModel = NULL;
        if ( RetValue == 0  && (Abc_NtkLatchNum(pNtk) == 0) )
        {
            pNtk->pModel = pNtkComb->pModel; pNtkComb->pModel = NULL;
            if ( pSecPar->fReportSolution )
                Abc_Print( 1, "SOLUTION: FAIL       " );
            else
                Abc_Print( 1, "SATISFIABLE    " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
        Abc_NtkDelete( pNtkComb );
        // return the result, if solved
        if ( RetValue == 1 )
        {
            if ( pSecPar->fReportSolution )
                Abc_Print( 1, "SOLUTION: PASS       " );
            else
                Abc_Print( 1, "UNSATISFIABLE  " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
        // return undecided, if the miter is combinational
        if ( Abc_NtkLatchNum(pNtk) == 0 )
        {
            Abc_Print( 1, "UNDECIDED      " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
    }
    // derive the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( pMan->nRegs > 0 );

    if ( pSecPar->fTryBmc )
    {
        RetValue = Saig_BmcPerform( pMan, 0, nBmcFramesMax, 2000, 0, nBmcConfMax, 0, pSecPar->fVerbose, 0, &iFrame, 0, 0 );
        if ( RetValue == 0 )
        {
            Abc_Print( 1, "Networks are not equivalent.\n" );
            if ( pSecPar->fReportSolution )
            {
                Abc_Print( 1, "SOLUTION: FAIL       " );
                ABC_PRT( "Time", Abc_Clock() - clkTotal );
            }
            // return the counter-example generated
            ABC_FREE( pNtk->pModel );
            ABC_FREE( pNtk->pSeqModel );
            pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
            Aig_ManStop( pMan );
            return RetValue;
        }
    } 
    // perform verification
    if ( pSecPar->fUseNewProver )
    {
        RetValue = Ssw_SecGeneralMiter( pMan, NULL );
    }
    else
    {
        RetValue = Fra_FraigSec( pMan, pSecPar, NULL );
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
        if ( pNtk->pSeqModel )
        {
            Abc_Cex_t * pCex = pNtk->pSeqModel;
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", pCex->iPo, pNtk->pName, pCex->iFrame );
            if ( !Saig_ManVerifyCex( pMan, pNtk->pSeqModel ) )
                Abc_Print( 1, "Abc_NtkDarProve(): Counter-example verification has FAILED.\n" );
        }
    }
    Aig_ManStop( pMan );
    return RetValue;
}